

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

LightBounds * __thiscall pbrt::SpotLight::Bounds(SpotLight *this)

{
  Vector3<float> *in_RSI;
  LightBounds *in_RDI;
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  Point3<float> PVar5;
  Vector3<float> VVar6;
  Vector3<float> *in_stack_00000038;
  Transform *in_stack_00000040;
  Float phi;
  Vector3f w;
  Point3f p;
  Point3<float> *in_stack_000000d8;
  Transform *in_stack_000000e0;
  float in_stack_ffffffffffffff28;
  float in_stack_ffffffffffffff2c;
  DenselySampledSpectrum *this_00;
  Vector3<float> *pVVar7;
  undefined1 *puVar8;
  undefined4 in_stack_ffffffffffffff58;
  float fVar9;
  LightBounds *this_01;
  undefined1 local_5c [12];
  undefined8 local_50;
  float local_48;
  undefined8 local_44;
  float local_3c;
  undefined8 local_38;
  float local_30;
  undefined1 local_24 [36];
  undefined1 auVar4 [56];
  
  pVVar7 = in_RSI + 2;
  this_00 = (DenselySampledSpectrum *)local_24;
  auVar4 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
  this_01 = in_RDI;
  Point3<float>::Point3
            ((Point3<float> *)this_00,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,0.0);
  PVar5 = Transform::operator()(in_stack_000000e0,in_stack_000000d8);
  local_30 = PVar5.super_Tuple3<pbrt::Point3,_float>.z;
  auVar1._0_8_ = PVar5.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar1._8_56_ = auVar4;
  local_38 = vmovlpd_avx(auVar1._0_16_);
  puVar8 = local_5c;
  auVar4 = ZEXT856(0);
  local_24._12_8_ = local_38;
  local_24._20_4_ = local_30;
  Vector3<float>::Vector3
            ((Vector3<float> *)this_00,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,0.0);
  VVar6 = Transform::operator()(in_stack_00000040,in_stack_00000038);
  local_48 = VVar6.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar2._0_8_ = VVar6.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar2._8_56_ = auVar4;
  local_50 = vmovlpd_avx(auVar2._0_16_);
  VVar6 = Normalize<float>(in_RSI);
  local_3c = VVar6.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar3._0_8_ = VVar6.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar3._8_56_ = auVar4;
  local_44 = vmovlpd_avx(auVar3._0_16_);
  fVar9 = in_RSI[0x10].super_Tuple3<pbrt::Vector3,_float>.x;
  DenselySampledSpectrum::MaxValue(this_00);
  std::acos((double)(ulong)(uint)in_RSI[0x10].super_Tuple3<pbrt::Vector3,_float>.z);
  LightBounds::LightBounds
            (this_01,(Point3f *)CONCAT44(fVar9,in_stack_ffffffffffffff58),in_RSI,
             (Float)((ulong)puVar8 >> 0x20),SUB84(puVar8,0),(Float)((ulong)pVVar7 >> 0x20),
             SUB81((ulong)pVVar7 >> 0x18,0));
  return in_RDI;
}

Assistant:

LightBounds SpotLight::Bounds() const {
    Point3f p = renderFromLight(Point3f(0, 0, 0));
    Vector3f w = Normalize(renderFromLight(Vector3f(0, 0, 1)));
    // As in Phi()
#if 0
    Float phi = scale * I.MaxValue() * 2 * Pi * ((1 - cosFalloffStart) +
                                          (cosFalloffStart - cosFalloffEnd) / 2);
#else
    // cf. room-subsurf-from-kd.pbrt test: we sorta kinda actually want to
    // compute power as if it was an isotropic light source; the
    // LightBounds geometric terms give zero importance outside the spot
    // light's cone, so inside the cone, it doesn't matter if the overall
    // power is low; it's more accurate to effectively treat it as a point
    // light source.
    Float phi = scale * I.MaxValue() * 4 * Pi;
#endif

    return LightBounds(p, w, phi, 0.f, std::acos(cosFalloffEnd), false);
}